

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O3

Activation * __thiscall
PyreNet::ActivationFactory::generateActivation(ActivationFactory *this,activationType activation)

{
  _func_int **pp_Var1;
  Activation *pAVar2;
  undefined8 *puVar3;
  
  if (activation < (relu|linear)) {
    pp_Var1 = (_func_int **)(&PTR_PTR_0010cb40)[activation];
    pAVar2 = (Activation *)operator_new(8);
    pAVar2->_vptr_Activation = pp_Var1;
    return pAVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = std::operator>>;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

Activation *
    ActivationFactory::generateActivation(LayerDefinition::activationType activation) { // generate dynamic class
        switch (activation) {
            case LayerDefinition::step: {
                return new Step();
            }
            case LayerDefinition::linear: {
                return new Linear();
            }
            case LayerDefinition::tanh: {
                return new Tanh();
            }
            case LayerDefinition::sigmoid: {
                return new Sigmoid();
            }
            case LayerDefinition::relu: {
                return new Relu();
            }
            default: {
                throw std::exception();
            }
        }
    }